

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3PagerExclusiveLock(Pager *pPager)

{
  int iVar1;
  long in_RDI;
  int rc;
  int in_stack_ffffffffffffffec;
  uint in_stack_fffffffffffffff0;
  
  iVar1 = *(int *)(in_RDI + 0x30);
  if ((iVar1 == 0) && (*(long *)(in_RDI + 0x128) == 0)) {
    iVar1 = pager_wait_on_lock((Pager *)(ulong)in_stack_fffffffffffffff0,in_stack_ffffffffffffffec);
  }
  return iVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3PagerExclusiveLock(Pager *pPager){
  int rc = pPager->errCode;
  assert( assert_pager_state(pPager) );
  if( rc==SQLITE_OK ){
    assert( pPager->eState==PAGER_WRITER_CACHEMOD
         || pPager->eState==PAGER_WRITER_DBMOD
         || pPager->eState==PAGER_WRITER_LOCKED
    );
    assert( assert_pager_state(pPager) );
    if( 0==pagerUseWal(pPager) ){
      rc = pager_wait_on_lock(pPager, EXCLUSIVE_LOCK);
    }
  }
  return rc;
}